

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL CopyFileW(LPCWSTR lpExistingFileName,LPCWSTR lpNewFileName,BOOL bFailIfExists)

{
  long lVar1;
  int iVar2;
  DWORD DVar3;
  size_t sVar4;
  char *lpMultiByteStr;
  char *lpMultiByteStr_00;
  long in_FS_OFFSET;
  DWORD dwLastError_1;
  DWORD dwLastError;
  BOOL bRet;
  int length;
  int dest_size;
  int src_size;
  char *dest;
  char *source;
  CPalThread *pThread;
  BOOL bFailIfExists_local;
  LPCWSTR lpNewFileName_local;
  LPCWSTR lpExistingFileName_local;
  PathCharString destPathString;
  PathCharString sourcePathString;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&destPathString.m_count);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpExistingFileName_local);
  dwLastError = 0;
  dwLastError_1 = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpExistingFileName != (LPCWSTR)0x0) {
    sVar4 = PAL_wcslen(lpExistingFileName);
    dwLastError = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
  }
  lpMultiByteStr =
       StackString<32UL,_char>::OpenStringBuffer
                 ((StackString<32UL,_char> *)&destPathString.m_count,(long)(int)dwLastError);
  if (lpMultiByteStr == (char *)0x0) {
    CorUnix::CPalThread::SetLastError(8);
  }
  else {
    iVar2 = WideCharToMultiByte(0,0,lpExistingFileName,-1,lpMultiByteStr,dwLastError,(LPCSTR)0x0,
                                (LPBOOL)0x0);
    StackString<32UL,_char>::CloseBuffer
              ((StackString<32UL,_char> *)&destPathString.m_count,(long)iVar2);
    if (iVar2 == 0) {
      DVar3 = GetLastError();
      if (DVar3 == 0x7a) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        CorUnix::CPalThread::SetLastError(0xce);
      }
      else {
        fprintf(_stderr,"] %s %s:%d","CopyFileW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x459);
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
        CorUnix::CPalThread::SetLastError(0x54f);
      }
    }
    else {
      dwLastError = 0;
      if (lpNewFileName != (LPCWSTR)0x0) {
        sVar4 = PAL_wcslen(lpNewFileName);
        dwLastError = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
      }
      lpMultiByteStr_00 =
           StackString<32UL,_char>::OpenStringBuffer
                     ((StackString<32UL,_char> *)&lpExistingFileName_local,(long)(int)dwLastError);
      if (lpMultiByteStr_00 == (char *)0x0) {
        CorUnix::CPalThread::SetLastError(8);
      }
      else {
        iVar2 = WideCharToMultiByte(0,0,lpNewFileName,-1,lpMultiByteStr_00,dwLastError,(LPCSTR)0x0,
                                    (LPBOOL)0x0);
        StackString<32UL,_char>::CloseBuffer
                  ((StackString<32UL,_char> *)&lpExistingFileName_local,(long)iVar2);
        if (iVar2 == 0) {
          DVar3 = GetLastError();
          if (DVar3 == 0x7a) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            CorUnix::CPalThread::SetLastError(0xce);
          }
          else {
            fprintf(_stderr,"] %s %s:%d","CopyFileW",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                    ,0x479);
            fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
            CorUnix::CPalThread::SetLastError(0x54f);
          }
        }
        else {
          dwLastError_1 = CopyFileA(lpMultiByteStr,lpMultiByteStr_00,bFailIfExists);
        }
      }
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpExistingFileName_local);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&destPathString.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return dwLastError_1;
  }
  abort();
}

Assistant:

BOOL
PALAPI
CopyFileW(
      IN LPCWSTR lpExistingFileName,
      IN LPCWSTR lpNewFileName,
      IN BOOL bFailIfExists)
{
    CPalThread *pThread;
    PathCharString sourcePathString;
    PathCharString destPathString;
    char * source;
    char * dest;
    int src_size, dest_size, length = 0;
    BOOL bRet = FALSE;

    PERF_ENTRY(CopyFileW);
    ENTRY("CopyFileW(lpExistingFileName=%p (%S), lpNewFileName=%p (%S), bFailIfExists=%d)\n",
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpExistingFileName?lpExistingFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING,
          lpNewFileName?lpNewFileName:W16_NULLSTRING, bFailIfExists);

    pThread = InternalGetCurrentThread();
    if (lpExistingFileName != NULL)
    {
        length = (PAL_wcslen(lpExistingFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    source = sourcePathString.OpenStringBuffer(length);
    if (NULL == source)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }

    src_size = WideCharToMultiByte( CP_ACP, 0, lpExistingFileName, -1, source, length,
                                NULL, NULL );
    sourcePathString.CloseBuffer(src_size);
    
    if( src_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpExistingFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto done;
    }

    length = 0;
    if (lpNewFileName != NULL)
    {
        length = (PAL_wcslen(lpNewFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    dest = destPathString.OpenStringBuffer(length);
    if (NULL == dest)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    dest_size = WideCharToMultiByte( CP_ACP, 0, lpNewFileName, -1, dest, length,
                                NULL, NULL );
    destPathString.CloseBuffer(dest_size);
    
    if( dest_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpNewFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto done;
    }

    bRet = CopyFileA(source,dest,bFailIfExists);

done:
    LOGEXIT("CopyFileW returns BOOL %d\n", bRet);
    PERF_EXIT(CopyFileW);
    return bRet;
}